

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Time.cpp
# Opt level: O1

void __thiscall
axl::sys::Time::setTimestampImpl(Time *this,uint64_t timestamp,bool isLocal,int timeZone)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  short sVar3;
  int iVar4;
  undefined7 in_register_00000011;
  time64_t posixTime;
  tm tmStruct;
  long local_50;
  tm local_48;
  
  local_50 = timestamp / 10000000 - 0x2b6109100;
  if ((int)CONCAT71(in_register_00000011,isLocal) == 0) {
    if (timeZone - 100U < 0xffffff39) {
      iVar4 = timeZone + (timeZone / 100) * -0x28;
    }
    else {
      iVar4 = timeZone * 0x3c;
    }
    local_50 = local_50 + iVar4 * 0x3c;
    gmtime_r(&local_50,&local_48);
  }
  else {
    localtime_r(&local_50,&local_48);
  }
  *(short *)this = (short)local_48.tm_year + 0x76c;
  *(undefined2 *)(this + 2) = (undefined2)local_48.tm_mon;
  *(undefined2 *)(this + 4) = (undefined2)local_48.tm_mday;
  *(undefined2 *)(this + 6) = (undefined2)local_48.tm_wday;
  *(undefined2 *)(this + 8) = (undefined2)local_48.tm_hour;
  *(undefined2 *)(this + 10) = (undefined2)local_48.tm_min;
  *(undefined2 *)(this + 0xc) = (undefined2)local_48.tm_sec;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = timestamp / 10000;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = timestamp / 10;
  *(short *)(this + 0xe) =
       (short)(timestamp / 10000) + SUB162(auVar1 * ZEXT816(0x4189374bc6a7f0),8) * -1000;
  sVar3 = (short)(timestamp / 10);
  *(short *)(this + 0x10) =
       sVar3 + (short)(SUB164(auVar2 * ZEXT816(0x20c49ba5e353f7cf),8) >> 7) * -1000;
  *(short *)(this + 0x12) = ((short)timestamp + sVar3 * -10) * 100;
  return;
}

Assistant:

void
Time::setTimestampImpl(
	uint64_t timestamp,
	bool isLocal,
	int timeZone
) {
#if (_AXL_OS_WIN)
	SYSTEMTIME sysTime = { 0 };

	if (isLocal)
		::FileTimeToLocalFileTime((const FILETIME*)&timestamp, (FILETIME*)&timestamp);
	else
		timestamp += (int64_t)getTimeZoneOffsetInMinutes(timeZone) * 60 * 10000000;

	::FileTimeToSystemTime((const FILETIME*)&timestamp, &sysTime);

	m_year        = sysTime.wYear;
	m_month       = sysTime.wMonth - 1;
	m_monthDay    = sysTime.wDay;
	m_dayOfWeek   = sysTime.wDayOfWeek;
	m_hour        = sysTime.wHour;
	m_minute      = sysTime.wMinute;
	m_second      = sysTime.wSecond;

#else
	struct tm tmStruct;

	time64_t posixTime = timestamp / 10000000 - AXL_SYS_EPOCH_DIFF;

	if (isLocal) {
		localtime64_r(&posixTime, &tmStruct);
	} else {
		posixTime += getTimeZoneOffsetInMinutes(timeZone) * 60;
		gmtime64_r(&posixTime, &tmStruct);
	}

	m_year        = tmStruct.tm_year + 1900;
	m_month       = tmStruct.tm_mon;
	m_monthDay    = tmStruct.tm_mday;
	m_dayOfWeek   = tmStruct.tm_wday;
	m_hour        = tmStruct.tm_hour;
	m_minute      = tmStruct.tm_min;
	m_second      = tmStruct.tm_sec;
#endif

	m_milliSecond = (timestamp / 10000) % 1000;
	m_microSecond = (timestamp / 10) % 1000;
	m_nanoSecond  = (timestamp % 10) * 100;
}